

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O0

void move_into_trap(trap *ttmp)

{
  xchar xVar1;
  xchar xVar2;
  boolean bVar3;
  boolean local_1b;
  xchar local_1a;
  xchar local_19;
  xchar local_18;
  xchar local_17;
  xchar local_16;
  xchar local_15;
  boolean unused;
  xchar cy;
  int iStack_14;
  xchar cx;
  xchar by;
  xchar bx;
  xchar y;
  xchar x;
  int bc;
  trap *ttmp_local;
  
  local_15 = ttmp->tx;
  local_16 = ttmp->ty;
  _by = ttmp;
  if ((uball != (obj *)0x0) &&
     (bVar3 = drag_ball(local_15,local_16,&stack0xffffffffffffffec,&local_17,&local_18,&local_19,
                        &local_1a,&local_1b,'\x01'), bVar3 == '\0')) {
    return;
  }
  xVar2 = u.uy;
  xVar1 = u.ux;
  u.ux0 = u.ux;
  u.uy0 = u.uy;
  u.ux = local_15;
  u.uy = local_16;
  u.umoved = '\x01';
  newsym((int)xVar1,(int)xVar2);
  vision_recalc(1);
  check_leash(u.ux0,u.uy0);
  if (uball != (obj *)0x0) {
    move_bc(0,iStack_14,local_17,local_18,local_19,local_1a);
  }
  spoteffects('\0');
  exercise(2,'\0');
  return;
}

Assistant:

static void move_into_trap(struct trap *ttmp)
{
	int bc;
	xchar x = ttmp->tx, y = ttmp->ty, bx, by, cx, cy;
	boolean unused;

	/* we know there's no monster in the way, and we're not trapped */
	if (!Punished || drag_ball(x, y, &bc, &bx, &by, &cx, &cy, &unused,
		TRUE)) {
	    u.ux0 = u.ux,  u.uy0 = u.uy;
	    u.ux = x,  u.uy = y;
	    u.umoved = TRUE;
	    newsym(u.ux0, u.uy0);
	    vision_recalc(1);
	    check_leash(u.ux0, u.uy0);
	    if (Punished) move_bc(0, bc, bx, by, cx, cy);
	    spoteffects(FALSE);	/* dotrap() */
	    exercise(A_WIS, FALSE);
	}
}